

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

TextureFormat sglr::toNonSRGBFormat(TextureFormat *fmt)

{
  TextureFormat *fmt_local;
  
  if (fmt->order == sRGB) {
    tcu::TextureFormat::TextureFormat((TextureFormat *)&fmt_local,RGB,fmt->type);
  }
  else if (fmt->order == sRGBA) {
    tcu::TextureFormat::TextureFormat((TextureFormat *)&fmt_local,RGBA,fmt->type);
  }
  else {
    fmt_local = *(TextureFormat **)fmt;
  }
  return (TextureFormat)fmt_local;
}

Assistant:

tcu::TextureFormat toNonSRGBFormat (const tcu::TextureFormat& fmt)
{
	switch (fmt.order)
	{
		case tcu::TextureFormat::sRGB:
			return tcu::TextureFormat(tcu::TextureFormat::RGB,	fmt.type);
		case tcu::TextureFormat::sRGBA:
			return tcu::TextureFormat(tcu::TextureFormat::RGBA,	fmt.type);
		default:
			return fmt;
	}
}